

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_util.cpp
# Opt level: O1

PeerManager * EnsurePeerman(NodeContext *node)

{
  PeerManager *pPVar1;
  UniValue *__return_storage_ptr__;
  long in_FS_OFFSET;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pPVar1 = (node->peerman)._M_t.
           super___uniq_ptr_impl<PeerManager,_std::default_delete<PeerManager>_>._M_t.
           super__Tuple_impl<0UL,_PeerManager_*,_std::default_delete<PeerManager>_>.
           super__Head_base<0UL,_PeerManager_*,_false>._M_head_impl;
  if (pPVar1 == (PeerManager *)0x0) {
    __return_storage_ptr__ = (UniValue *)__cxa_allocate_exception(0x58);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Error: Peer-to-peer functionality missing or disabled","");
    JSONRPCError(__return_storage_ptr__,-0x1f,&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(__return_storage_ptr__,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pPVar1;
  }
  __stack_chk_fail();
}

Assistant:

PeerManager& EnsurePeerman(const NodeContext& node)
{
    if (!node.peerman) {
        throw JSONRPCError(RPC_CLIENT_P2P_DISABLED, "Error: Peer-to-peer functionality missing or disabled");
    }
    return *node.peerman;
}